

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handypack.hpp
# Opt level: O0

void NHandyPack::
     TVectorSerializer<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_unsigned_char>::
     Dump(ostream *out,vector<unsigned_char,_std::allocator<unsigned_char>_> *object)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  bool bVar1;
  size_type sVar2;
  reference t;
  uchar *obj;
  const_iterator __end0;
  const_iterator __begin0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvStack_18;
  uint32_t size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *object_local;
  ostream *out_local;
  
  pvStack_18 = object;
  object_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)out;
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(object);
  __range2._4_4_ = (undefined4)sVar2;
  std::ostream::write((char *)object_local,(long)&__range2 + 4);
  this = pvStack_18;
  __end0 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(pvStack_18);
  obj = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&obj);
    if (!bVar1) break;
    t = __gnu_cxx::
        __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator*(&__end0);
    Dump<unsigned_char>((ostream *)object_local,t);
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

static inline void Dump(std::ostream& out, const TVec& object) {
        uint32_t size = object.size();
        out.write((const char*)(&size), sizeof(size));
        for (const auto& obj: object) {
            NHandyPack::Dump(out, obj);
        }
    }